

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_timer.c
# Opt level: O2

void test_cancel_settime_in_cancel_fails(void)

{
  cio_error cVar1;
  _func_int_int_int_itimerspec_ptr_itimerspec_ptr *custom_fakes [2];
  cio_timer timer;
  
  timerfd_settime_fake.custom_fake_seq = custom_fakes;
  timerfd_create_fake.return_val = 5;
  read_fake.custom_fake = read_blocks;
  custom_fakes[0] = settime_ok;
  custom_fakes[1] = settime_fails;
  timerfd_settime_fake.custom_fake_seq_len = 2;
  cVar1 = cio_timer_init(&timer,(cio_eventloop *)0x0,(cio_timer_close_hook_t)0x0);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x136,UNITY_DISPLAY_STYLE_INT);
  cio_timer_expires_from_now(&timer,2000,handle_timeout,(void *)0x0);
  cVar1 = cio_timer_cancel(&timer);
  if (cVar1 != CIO_SUCCESS) {
    UnityAssertEqualNumber
              (0,(ulong)handle_timeout_fake.call_count,(char *)0x0,0x13c,UNITY_DISPLAY_STYLE_INT);
    return;
  }
  UnityFail("timer cancel did not failed when settime fails!",0x13b);
}

Assistant:

static void test_cancel_settime_in_cancel_fails(void)
{
	static const int timerfd = 5;
	timerfd_create_fake.return_val = timerfd;
	read_fake.custom_fake = read_blocks;

	int (*custom_fakes[])(int, int, const struct itimerspec *, struct itimerspec *) =
	    {settime_ok,
	     settime_fails};
	SET_CUSTOM_FAKE_SEQ(timerfd_settime, custom_fakes, ARRAY_SIZE(custom_fakes))

	struct cio_timer timer;
	enum cio_error err = cio_timer_init(&timer, NULL, NULL);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);

	cio_timer_expires_from_now(&timer, 2000, handle_timeout, NULL);

	err = cio_timer_cancel(&timer);
	TEST_ASSERT_MESSAGE(err != CIO_SUCCESS, "timer cancel did not failed when settime fails!");
	TEST_ASSERT_EQUAL(0, handle_timeout_fake.call_count);
}